

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O0

void mkshop(level *lev)

{
  boolean bVar1;
  int iVar2;
  int local_34;
  int local_30;
  int y;
  int x;
  int i;
  char *ep;
  int j;
  int styp;
  mkroom *sroom;
  level *lev_local;
  
  _x = (char *)0x0;
  ep._4_4_ = -1;
  if ((flags.debug != '\0') && (_x = nh_getenv("SHOPTYPE"), _x != (char *)0x0)) {
    y = 0;
    while (shtypes[y].name != (char *)0x0) {
      iVar2 = strcmp(shtypes[y].name,_x);
      if ((iVar2 == 0) || (*_x == ""[(int)shtypes[y].symb])) {
        ep._4_4_ = y;
        goto LAB_002415c0;
      }
      y = y + 1;
    }
    if ((*_x == 'z') || (*_x == 'Z')) {
      mkzoo(lev,8);
      return;
    }
    if ((*_x == 'm') || (*_x == 'M')) {
      mkzoo(lev,6);
      return;
    }
    if ((*_x == 'b') || (*_x == 'B')) {
      mkzoo(lev,5);
      return;
    }
    if ((*_x == 'p') || (*_x == 'P')) {
      mkzoo(lev,0x10);
      return;
    }
    if ((*_x == 't') || (*_x == 'T')) {
      mkzoo(lev,2);
      return;
    }
    if ((*_x == 's') || (*_x == 'S')) {
      mkzoo(lev,7);
      return;
    }
    if ((*_x == 'a') || (*_x == 'A')) {
      mkzoo(lev,0xd);
      return;
    }
    if ((*_x == 'c') || (*_x == 'C')) {
      mkzoo(lev,0xc);
      return;
    }
    if ((*_x == 'r') || (*_x == 'R')) {
      mkzoo(lev,0xf);
      return;
    }
    if ((*_x == 'l') || (*_x == 'L')) {
      mkzoo(lev,0xb);
      return;
    }
    if ((*_x == 'o') || (*_x == 'O')) {
      mkpoolroom(lev);
      return;
    }
    if (*_x == '_') {
      mktemple(lev);
      return;
    }
    if (*_x == 'n') {
      mkgarden(lev,(mkroom *)0x0);
      return;
    }
    if (*_x == '}') {
      mkswamp(lev);
      return;
    }
    if ((*_x == 'g') || (*_x == 'G')) {
      ep._4_4_ = 0;
    }
    else {
      ep._4_4_ = -1;
    }
  }
LAB_002415c0:
  _j = lev->rooms;
  while( true ) {
    if (_j->hx < '\0') {
      return;
    }
    if ((long)lev->nroom <= ((long)_j - (long)lev->rooms) / 0xd8) break;
    if ((((_j->rtype == '\0') && (bVar1 = has_dnstairs(lev,_j), bVar1 == '\0')) &&
        (bVar1 = has_upstairs(lev,_j), bVar1 == '\0')) &&
       ((((flags.debug != '\0' && (_x != (char *)0x0)) && (_j->doorct != '\0')) ||
        (_j->doorct == '\x01')))) {
      if (_j->rlit == '\0') {
        for (local_30 = _j->lx + -1; local_30 <= _j->hx + 1; local_30 = local_30 + 1) {
          for (local_34 = _j->ly + -1; local_34 <= _j->hy + 1; local_34 = local_34 + 1) {
            *(uint *)&lev->locations[local_30][local_34].field_0x6 =
                 *(uint *)&lev->locations[local_30][local_34].field_0x6 & 0xfffffbff | 0x400;
          }
        }
        _j->rlit = '\x01';
      }
      if (ep._4_4_ < 0) {
        ep._0_4_ = rnd(100);
        ep._4_4_ = 0;
        while (ep._0_4_ = (int)ep - shtypes[ep._4_4_].prob, 0 < (int)ep) {
          ep._4_4_ = ep._4_4_ + 1;
        }
        bVar1 = isbig(_j);
        if ((bVar1 != '\0') &&
           ((shtypes[ep._4_4_].symb == '\v' || (shtypes[ep._4_4_].symb == '\n')))) {
          ep._4_4_ = 0;
        }
      }
      _j->rtype = (char)ep._4_4_ + '\x12';
      topologize(lev,_j);
      stock_room(ep._4_4_,lev,_j);
      return;
    }
    _j = _j + 1;
  }
  pline("lev->rooms not closed by -1?");
  return;
}

Assistant:

static void mkshop(struct level *lev)
{
	struct mkroom *sroom;
	int styp, j;
	char *ep = NULL;

	/* first determine shoptype */
	styp = -1;
	if (wizard) {
		ep = nh_getenv("SHOPTYPE");
		if (ep) {
			int i;
			for (i = 0; shtypes[i].name; i++) {
				if (!strcmp(shtypes[i].name, ep) ||
				    ep[0] == def_oc_syms[(int)shtypes[i].symb]) {
				    styp = i;
				    goto gottype;
				}
			}
			if (ep[0] == 'z' || ep[0] == 'Z') {
				mkzoo(lev, ZOO);
				return;
			}
			if (ep[0] == 'm' || ep[0] == 'M') {
				mkzoo(lev, MORGUE);
				return;
			}
			if (ep[0] == 'b' || ep[0] == 'B') {
				mkzoo(lev, BEEHIVE);
				return;
			}
			if (ep[0] == 'p' || ep[0] == 'P') {
				mkzoo(lev, LEMUREPIT);
				return;
			}
			if (ep[0] == 't' || ep[0] == 'T') {
				mkzoo(lev, COURT);
				return;
			}
			if (ep[0] == 's' || ep[0] == 'S') {
				mkzoo(lev, BARRACKS);
				return;
			}
			if (ep[0] == 'a' || ep[0] == 'A') {
				mkzoo(lev, ANTHOLE);
				return;
			}
			if (ep[0] == 'c' || ep[0] == 'C') {
				mkzoo(lev, COCKNEST);
				return;
			}
			if (ep[0] == 'r' || ep[0] == 'R') {
				mkzoo(lev, ARMORY);
				return;
			}
			if (ep[0] == 'l' || ep[0] == 'L') {
				mkzoo(lev, LEPREHALL);
				return;
			}
			if (ep[0] == 'o' || ep[0] == 'O') {
				mkpoolroom(lev);
				return;
			}
			if (ep[0] == '_') {
				mktemple(lev);
				return;
			}
			if (ep[0] == 'n') {
				mkgarden(lev, NULL);
				return;
			}
			if (ep[0] == '}') {
				mkswamp(lev);
				return;
			}
			if (ep[0] == 'g' || ep[0] == 'G')
				styp = 0;
			else
				styp = -1;
		}
	}
gottype:
	for (sroom = &lev->rooms[0]; ; sroom++){
		if (sroom->hx < 0) return;
		if (sroom - lev->rooms >= lev->nroom) {
			pline("lev->rooms not closed by -1?");
			return;
		}
		if (sroom->rtype != OROOM) continue;
		if (has_dnstairs(lev, sroom) || has_upstairs(lev, sroom))
			continue;
		if ((wizard && ep && sroom->doorct != 0) || sroom->doorct == 1)
			break;
	}
	if (!sroom->rlit) {
		int x, y;

		for (x = sroom->lx - 1; x <= sroom->hx + 1; x++)
		for (y = sroom->ly - 1; y <= sroom->hy + 1; y++)
			lev->locations[x][y].lit = 1;
		sroom->rlit = 1;
	}

	if (styp < 0) {
		/* pick a shop type at random */
		j = rnd(100);
		for (styp = 0; (j -= shtypes[styp].prob) > 0; styp++)
			continue;

		/* big rooms cannot be wand or book shops,
		 * - so make them general stores
		 */
		if (isbig(sroom) && (shtypes[styp].symb == WAND_CLASS ||
				     shtypes[styp].symb == SPBOOK_CLASS))
			styp = 0;
	}

	sroom->rtype = SHOPBASE + styp;

	/* set room bits before stocking the shop */
	topologize(lev, sroom);

	/* stock the room with a shopkeeper and artifacts */
	stock_room(styp, lev, sroom);
}